

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  size_t sVar1;
  char *src_00;
  long lVar2;
  undefined8 properties_00;
  int iVar3;
  ptls_key_schedule_t *ppVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  size_t len;
  size_t sVar7;
  uint8_t *puVar8;
  bool bVar9;
  ptls_iovec_t pVar10;
  ptls_message_emitter_t *local_d80;
  ptls_message_emitter_t *local_d58;
  ptls_key_exchange_algorithm_t *local_d50;
  size_t body_size_36;
  size_t body_size_37;
  size_t body_size_38;
  size_t body_start_38;
  size_t capacity_38;
  size_t sStack_cf0;
  uint16_t _v_32;
  size_t body_start_37;
  size_t capacity_37;
  ptls_buffer_t *local_cd8;
  ptls_buffer_t *sendbuf_3;
  size_t body_start_36;
  size_t capacity_36;
  size_t local_cb8;
  size_t mess_start_5;
  ptls_key_schedule_t *_key_sched_5;
  ptls_buffer_t *_buf_5;
  ptls_message_emitter_t *_emitter_5;
  size_t body_size_28;
  size_t body_size_29;
  size_t body_size_35;
  size_t body_start_35;
  size_t capacity_35;
  ulong uStack_c68;
  uint16_t _v_31;
  size_t body_size_32;
  size_t body_size_33;
  size_t body_size_34;
  size_t body_start_34;
  size_t capacity_34;
  size_t body_start_33;
  size_t capacity_33;
  size_t body_start_32;
  size_t capacity_32;
  ulong uStack_c18;
  uint16_t _v_30;
  size_t body_size_31;
  size_t body_start_31;
  size_t capacity_31;
  ulong uStack_bf8;
  uint16_t _v_29;
  size_t body_size_30;
  size_t body_start_30;
  size_t capacity_30;
  long lStack_bd8;
  uint16_t _v_28;
  size_t body_start_29;
  size_t capacity_29;
  ptls_buffer_t *sendbuf_2;
  size_t body_start_28;
  size_t capacity_28;
  size_t local_ba8;
  size_t mess_start_4;
  ptls_key_schedule_t *_key_sched_4;
  ptls_buffer_t *_buf_4;
  ptls_message_emitter_t *_emitter_4;
  size_t body_size_21;
  size_t body_size_23;
  size_t body_size_27;
  size_t sStack_b68;
  uint16_t _v_27;
  size_t body_start_27;
  size_t capacity_27;
  ulong uStack_b50;
  uint16_t _v_26;
  size_t body_size_25;
  size_t body_size_26;
  size_t body_start_26;
  size_t capacity_26;
  size_t sStack_b28;
  uint16_t _v_25;
  size_t body_start_25;
  size_t capacity_25;
  ptls_buffer_t *ppStack_b10;
  uint16_t _v_24;
  ptls_buffer_t *sendbuf_1;
  size_t body_size_24;
  size_t sStack_af8;
  uint16_t _v_23;
  size_t body_start_24;
  size_t capacity_24;
  size_t sStack_ae0;
  uint16_t _v_22;
  size_t body_start_23;
  size_t capacity_23;
  ulong uStack_ac8;
  uint16_t _v_21;
  size_t body_size_22;
  size_t body_start_22;
  size_t capacity_22;
  long lStack_aa8;
  uint16_t _v_20;
  size_t body_start_21;
  size_t capacity_21;
  size_t local_a90;
  size_t mess_start_3;
  ptls_key_schedule_t *_key_sched_3;
  ptls_buffer_t *_buf_3;
  ptls_message_emitter_t *_emitter_3;
  ptls_iovec_t *selected;
  ptls_iovec_t local_a58;
  ulong local_a48;
  size_t body_size_16;
  size_t body_size_18;
  size_t body_size_20;
  size_t sStack_a28;
  uint16_t _v_19;
  size_t body_start_20;
  size_t capacity_20;
  ptls_message_emitter_t *ppStack_a10;
  uint16_t _v_18;
  ptls_key_exchange_algorithm_t *_negotiated_group_2;
  size_t body_size_19;
  size_t sStack_9f8;
  uint16_t _v_17;
  size_t body_start_19;
  size_t capacity_19;
  size_t sStack_9e0;
  uint16_t _v_16;
  size_t body_start_18;
  size_t capacity_18;
  ulong uStack_9c8;
  uint16_t _v_15;
  size_t body_size_17;
  size_t body_start_17;
  size_t capacity_17;
  long lStack_9a8;
  uint16_t _v_14;
  size_t body_start_16;
  size_t capacity_16;
  size_t local_990;
  size_t mess_start_2;
  ptls_key_schedule_t *_key_sched_2;
  ptls_buffer_t *_buf_2;
  ptls_message_emitter_t *_emitter_2;
  ulong local_960;
  size_t body_size_6;
  size_t body_size_8;
  size_t body_size_11;
  size_t body_size_12;
  size_t body_size_15;
  size_t local_928;
  size_t sz_1;
  size_t body_start_15;
  size_t capacity_15;
  size_t tbs_len;
  size_t body_size_13;
  ulong local_8f8;
  size_t body_size_14;
  size_t sz;
  size_t body_start_14;
  size_t capacity_14;
  size_t body_start_13;
  size_t capacity_13;
  size_t tbs_start;
  size_t body_start_12;
  size_t capacity_12;
  size_t body_start_11;
  size_t capacity_11;
  ptls_buffer_t *ppStack_898;
  uint16_t _v_13;
  ptls_buffer_t *sendbuf;
  size_t body_size_10;
  size_t sStack_880;
  uint16_t _v_12;
  size_t body_start_10;
  size_t capacity_10;
  ptls_message_emitter_t *ppStack_868;
  uint16_t _v_11;
  ptls_key_exchange_algorithm_t *_negotiated_group_1;
  size_t body_size_9;
  size_t sStack_850;
  uint16_t _v_10;
  size_t body_start_9;
  size_t capacity_9;
  size_t sStack_838;
  uint16_t _v_9;
  size_t body_start_8;
  size_t capacity_8;
  ulong uStack_820;
  uint16_t _v_8;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  long lStack_800;
  uint16_t _v_7;
  size_t body_start_6;
  size_t capacity_6;
  size_t local_7e8;
  size_t mess_start_1;
  ptls_key_schedule_t *_key_sched_1;
  ptls_buffer_t *_buf_1;
  ptls_message_emitter_t *_emitter_1;
  ptls_key_exchange_algorithm_t *negotiated_group;
  size_t body_size;
  size_t body_size_2;
  size_t body_size_5;
  size_t body_start_5;
  size_t capacity_5;
  ulong uStack_790;
  uint16_t _v_6;
  size_t body_size_4;
  size_t sStack_780;
  uint16_t _v_5;
  size_t body_start_4;
  size_t capacity_4;
  ptls_key_exchange_algorithm_t *ppStack_768;
  uint16_t _v_4;
  ptls_key_exchange_algorithm_t *_negotiated_group;
  size_t body_size_3;
  size_t sStack_750;
  uint16_t _v_3;
  size_t body_start_3;
  size_t capacity_3;
  size_t sStack_738;
  uint16_t _v_2;
  size_t body_start_2;
  size_t capacity_2;
  ulong uStack_720;
  uint16_t _v_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  long lStack_700;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  size_t local_6e8;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  size_t hrr_start;
  uint8_t *local_6b0;
  size_t sigsize;
  uint8_t sig [64];
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint8_t *end;
  uint8_t *src;
  ptls_cipher_suite_t *cs;
  size_t l;
  ptls_on_client_hello_parameters_t params;
  undefined1 auStack_5c8 [4];
  int is_esni;
  ptls_iovec_t server_name;
  int ret;
  int is_second_flight;
  int accept_early_data;
  uint8_t finished_key [64];
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  size_t psk_index;
  ptls_key_exchange_algorithm_t *ppStack_538;
  anon_enum_32 mode;
  anon_struct_24_2_cc7b932a key_share;
  st_ptls_client_hello_t ch;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  sVar7 = message.len;
  puVar6 = message.base;
  ch._1248_8_ = properties;
  memset(&key_share.peer_key.len,0,0x4e8);
  ch.psk.ke_modes._0_2_ = 0xffff;
  memset(&stack0xfffffffffffffac8,0,0x18);
  pubkey.len = 0xffffffffffffffff;
  memset(&ecdh_secret.len,0,0x10);
  memset(finished_key + 0x38,0,0x10);
  ret = 0;
  bVar9 = tls->state == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
  if (((byte)tls->field_0x160 >> 5 & 1) == 0) {
    server_name.len._4_4_ =
         decode_client_hello(tls,(st_ptls_client_hello_t *)&key_share.peer_key.len,puVar6 + 4,
                             puVar6 + sVar7,(ptls_handshake_properties_t *)ch._1248_8_);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    if ((tls->ctx->field_0x68 & 1) != 0) {
      ch.psk.identities.count._0_4_ = (uint)ch.psk.identities.count & 0xfffffffe;
    }
    if (bVar9) {
      if (ch.psk.identities.count._4_4_ != 0) {
        server_name.len._4_4_ = 0x32;
        goto LAB_0012ad51;
      }
      iVar3 = (*ptls_mem_equal)(tls->client_random,(void *)key_share.peer_key.len,0x20);
      if (iVar3 == 0) {
        server_name.len._4_4_ = 0x28;
        goto LAB_0012ad51;
      }
      if ((tls->server_name != (char *)0x0) &&
         ((cs = (ptls_cipher_suite_t *)strlen(tls->server_name),
          (ptls_cipher_suite_t *)ch.server_name.base != cs ||
          (iVar3 = memcmp((void *)ch.signature_algorithms.count,tls->server_name,(size_t)cs),
          iVar3 != 0)))) {
        server_name.len._4_4_ = 0x28;
        goto LAB_0012ad51;
      }
    }
    else {
      *(undefined8 *)tls->client_random = *(undefined8 *)key_share.peer_key.len;
      *(undefined8 *)(tls->client_random + 8) = *(undefined8 *)(key_share.peer_key.len + 8);
      *(undefined8 *)(tls->client_random + 0x10) = *(undefined8 *)(key_share.peer_key.len + 0x10);
      *(undefined8 *)(tls->client_random + 0x18) = *(undefined8 *)(key_share.peer_key.len + 0x18);
      memset(auStack_5c8,0,0x10);
      params._84_4_ = 0;
      if ((ch.server_name.len == 0) || (tls->ctx->esni == (ptls_esni_context_t **)0x0)) {
        if (ch.signature_algorithms.count != 0) {
          _auStack_5c8 = (uint8_t *)ch.signature_algorithms.count;
          server_name.base = ch.server_name.base;
        }
      }
      else {
        server_name.len._4_4_ =
             client_hello_decrypt_esni
                       (tls->ctx,(ptls_iovec_t *)auStack_5c8,&tls->esni,
                        (st_ptls_client_hello_t *)&key_share.peer_key.len);
        if ((server_name.len._4_4_ != 0) ||
           ((tls->ctx->update_esni_key != (ptls_update_esni_key_t *)0x0 &&
            (server_name.len._4_4_ =
                  (*tls->ctx->update_esni_key->cb)
                            (tls->ctx->update_esni_key,tls,tls->esni->secret,
                             *(ptls_hash_algorithm_t **)(ch.server_name.len + 0x10),
                             tls->esni->esni_contents_hash), server_name.len._4_4_ != 0))))
        goto LAB_0012ad51;
        server_name.len._4_4_ = 0;
        params._84_4_ = 1;
      }
      if (tls->ctx->on_client_hello == (ptls_on_client_hello_t *)0x0) {
        server_name.len._4_4_ = 0;
      }
      else {
        l = (size_t)_auStack_5c8;
        params.server_name.base = server_name.base;
        params.server_name.len = (size_t)&ch.esni.encrypted_sni.len;
        params.negotiated_protocols.list = (ptls_iovec_t *)ch.alpn.list[0xf].len;
        params.negotiated_protocols.count = (size_t)&ch.key_shares.len;
        params.signature_algorithms.list = (uint16_t *)ch.signature_algorithms.list._24_8_;
        params.signature_algorithms.count = (size_t)&ch.alpn.count;
        params.certificate_compression_algorithms.list =
             (uint16_t *)ch.cert_compression_algos.list._24_8_;
        params.certificate_compression_algorithms.count = (size_t)&ch.cert_compression_algos.count;
        params.cipher_suites.list = (uint16_t *)ch.client_ciphers.list._56_8_;
        params.cipher_suites.count._0_1_ = (byte)params.cipher_suites.count & 0xfe | params._84_1_;
        server_name.len._4_4_ =
             (*tls->ctx->on_client_hello->cb)
                       (tls->ctx->on_client_hello,tls,(ptls_on_client_hello_parameters_t *)&l);
      }
      if (params._84_4_ != 0) {
        free(_auStack_5c8);
      }
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    }
    server_name.len._4_4_ =
         select_cipher((ptls_cipher_suite_t **)&src,tls->ctx->cipher_suites,(uint8_t *)ch._40_8_,
                       ch.cipher_suites.base + ch._40_8_);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    if (bVar9) {
      if (tls->cipher_suite != (ptls_cipher_suite_t *)src) {
        server_name.len._4_4_ = 0x28;
        goto LAB_0012ad51;
      }
    }
    else {
      tls->cipher_suite = (ptls_cipher_suite_t *)src;
      ppVar4 = key_schedule_new((ptls_cipher_suite_t *)src,(ptls_cipher_suite_t **)0x0,
                                tls->ctx->hkdf_label_prefix__obsolete);
      tls->key_schedule = ppVar4;
    }
    if ((ppStack_538 == (ptls_key_exchange_algorithm_t *)0x0) && (ch.negotiated_groups.len != 0)) {
      end = (uint8_t *)ch.negotiated_groups.len;
      puVar5 = ch.key_shares.base + ch.negotiated_groups.len;
      _block_size = 2;
      if ((long)puVar5 - ch.negotiated_groups.len < 2) {
        server_name.len._4_4_ = 0x32;
        goto LAB_0012ad51;
      }
      end_1 = (uint8_t *)0x0;
      do {
        puVar8 = end + 1;
        end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
        _block_size = _block_size - 1;
        end = puVar8;
      } while (_block_size != 0);
      if (puVar5 + -(long)puVar8 < end_1) {
        server_name.len._4_4_ = 0x32;
        goto LAB_0012ad51;
      }
      server_name.len._4_4_ =
           select_key_share(&stack0xfffffffffffffac8,(ptls_iovec_t *)&key_share,
                            tls->ctx->key_exchanges,&end,puVar8 + (long)end_1,0);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      if (end != puVar8 + (long)end_1) {
        server_name.len._4_4_ = 0x32;
        goto LAB_0012ad51;
      }
      if (end != puVar5) {
        server_name.len._4_4_ = 0x32;
        goto LAB_0012ad51;
      }
      server_name.len._4_4_ = 0;
    }
    if (!bVar9) {
      if ((ch.cookie.all.base == (uint8_t *)0x0) ||
         (ppStack_538 == (ptls_key_exchange_algorithm_t *)0x0)) {
        if ((ppStack_538 == (ptls_key_exchange_algorithm_t *)0x0) ||
           ((ch._1248_8_ != 0 && ((*(byte *)(ch._1248_8_ + 0x60) & 1) != 0)))) {
          if (ch.cipher_suites.len == 0) {
            server_name.len._4_4_ = 0x6d;
          }
          else {
            server_name.len._4_4_ =
                 select_negotiated_group
                           ((ptls_key_exchange_algorithm_t **)&_emitter_1,tls->ctx->key_exchanges,
                            (uint8_t *)ch.cipher_suites.len,
                            ch.negotiated_groups.base + ch.cipher_suites.len);
            if (server_name.len._4_4_ == 0) {
              ptls__key_schedule_update_hash(tls->key_schedule,puVar6,sVar7);
              if (tls->key_schedule->generation != 0) {
                __assert_fail("tls->key_schedule->generation == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                              ,0xe8a,
                              "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                             );
              }
              if ((ch._1248_8_ == 0) || ((*(byte *)(ch._1248_8_ + 0x60) >> 1 & 1) == 0)) {
                key_schedule_transform_post_ch1hash(tls->key_schedule);
                ppVar4 = tls->key_schedule;
                __emitter_2 = ptls_iovec_init((void *)0x0,0);
                key_schedule_extract(ppVar4,__emitter_2);
                _buf_2 = (ptls_buffer_t *)emitter;
                server_name.len._4_4_ = (*emitter->begin_message)(emitter);
                if (server_name.len._4_4_ == 0) {
                  _key_sched_2 = (ptls_key_schedule_t *)_buf_2->base;
                  mess_start_2 = (size_t)tls->key_schedule;
                  local_990 = *(size_t *)_key_sched_2->secret;
                  capacity_16._7_1_ = 2;
                  server_name.len._4_4_ =
                       ptls_buffer__do_pushv
                                 ((ptls_buffer_t *)_key_sched_2,(void *)((long)&capacity_16 + 7),1);
                  if (server_name.len._4_4_ == 0) {
                    body_start_16 = 3;
                    server_name.len._4_4_ =
                         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_2,"",3);
                    if (server_name.len._4_4_ == 0) {
                      lStack_9a8 = *(long *)_key_sched_2->secret;
                      capacity_17._6_2_ = 0x303;
                      capacity_17._4_1_ = 3;
                      capacity_17._5_1_ = 3;
                      server_name.len._4_4_ =
                           ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_17 + 4),2);
                      if ((server_name.len._4_4_ == 0) &&
                         (server_name.len._4_4_ = ptls_buffer_reserve(emitter->buf,0x20),
                         server_name.len._4_4_ == 0)) {
                        puVar5 = emitter->buf->base;
                        sVar7 = emitter->buf->off;
                        puVar6 = puVar5 + sVar7;
                        puVar6[0] = 0xcf;
                        puVar6[1] = '!';
                        puVar6[2] = 0xad;
                        puVar6[3] = 't';
                        puVar6[4] = 0xe5;
                        puVar6[5] = 0x9a;
                        puVar6[6] = 'a';
                        puVar6[7] = '\x11';
                        puVar6 = puVar5 + sVar7 + 8;
                        puVar6[0] = 0xbe;
                        puVar6[1] = '\x1d';
                        puVar6[2] = 0x8c;
                        puVar6[3] = '\x02';
                        puVar6[4] = '\x1e';
                        puVar6[5] = 'e';
                        puVar6[6] = 0xb8;
                        puVar6[7] = 0x91;
                        puVar6 = puVar5 + sVar7 + 0x10;
                        puVar6[0] = 0xc2;
                        puVar6[1] = 0xa2;
                        puVar6[2] = '\x11';
                        puVar6[3] = '\x16';
                        puVar6[4] = 'z';
                        puVar6[5] = 0xbb;
                        puVar6[6] = 0x8c;
                        puVar6[7] = '^';
                        puVar5 = puVar5 + sVar7 + 0x18;
                        puVar5[0] = '\a';
                        puVar5[1] = 0x9e;
                        puVar5[2] = '\t';
                        puVar5[3] = 0xe2;
                        puVar5[4] = 200;
                        puVar5[5] = 0xa8;
                        puVar5[6] = '3';
                        puVar5[7] = 0x9c;
                        emitter->buf->off = emitter->buf->off + 0x20;
                        body_start_17 = 1;
                        server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",1);
                        if (server_name.len._4_4_ == 0) {
                          body_size_17 = emitter->buf->off;
                          server_name.len._4_4_ =
                               ptls_buffer__do_pushv
                                         (emitter->buf,ch.random_bytes,
                                          (size_t)ch.legacy_session_id.base);
                          if (server_name.len._4_4_ == 0) {
                            uStack_9c8 = emitter->buf->off - body_size_17;
                            for (; body_start_17 != 0; body_start_17 = body_start_17 - 1) {
                              emitter->buf->base[body_size_17 - body_start_17] =
                                   (uint8_t)(uStack_9c8 >>
                                            (((char)body_start_17 + -1) * '\b' & 0x3fU));
                            }
                            capacity_18._6_2_ = tls->cipher_suite->id;
                            capacity_18._4_1_ = (undefined1)(capacity_18._6_2_ >> 8);
                            capacity_18._5_1_ = (undefined1)capacity_18._6_2_;
                            server_name.len._4_4_ =
                                 ptls_buffer__do_pushv
                                           (emitter->buf,(void *)((long)&capacity_18 + 4),2);
                            if (server_name.len._4_4_ == 0) {
                              capacity_18._3_1_ = 0;
                              server_name.len._4_4_ =
                                   ptls_buffer__do_pushv
                                             (emitter->buf,(void *)((long)&capacity_18 + 3),1);
                              if (server_name.len._4_4_ == 0) {
                                body_start_18 = 2;
                                server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
                                if (server_name.len._4_4_ == 0) {
                                  sStack_9e0 = emitter->buf->off;
                                  capacity_19._6_2_ = 0x2b;
                                  capacity_19._4_1_ = 0;
                                  capacity_19._5_1_ = 0x2b;
                                  server_name.len._4_4_ =
                                       ptls_buffer__do_pushv
                                                 (emitter->buf,(void *)((long)&capacity_19 + 4),2);
                                  if (server_name.len._4_4_ == 0) {
                                    body_start_19 = 2;
                                    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2)
                                    ;
                                    if (server_name.len._4_4_ == 0) {
                                      sStack_9f8 = emitter->buf->off;
                                      body_size_19._6_2_ = (undefined2)ch.compression_methods.count;
                                      body_size_19._4_1_ =
                                           (undefined1)
                                           ((ushort)(undefined2)ch.compression_methods.count >> 8);
                                      body_size_19._5_1_ =
                                           (undefined1)(undefined2)ch.compression_methods.count;
                                      server_name.len._4_4_ =
                                           ptls_buffer__do_pushv
                                                     (emitter->buf,(void *)((long)&body_size_19 + 4)
                                                      ,2);
                                      if (server_name.len._4_4_ == 0) {
                                        _negotiated_group_2 =
                                             (ptls_key_exchange_algorithm_t *)
                                             (emitter->buf->off - sStack_9f8);
                                        for (; body_start_19 != 0; body_start_19 = body_start_19 - 1
                                            ) {
                                          emitter->buf->base[sStack_9f8 - body_start_19] =
                                               (uint8_t)((ulong)_negotiated_group_2 >>
                                                        (((char)body_start_19 + -1) * '\b' & 0x3fU))
                                          ;
                                        }
                                        if (ppStack_538 == (ptls_key_exchange_algorithm_t *)0x0) {
                                          local_d80 = _emitter_1;
                                        }
                                        else {
                                          local_d80 = (ptls_message_emitter_t *)0x0;
                                        }
                                        ppStack_a10 = local_d80;
                                        if (local_d80 != (ptls_message_emitter_t *)0x0) {
                                          capacity_20._6_2_ = 0x33;
                                          capacity_20._4_1_ = 0;
                                          capacity_20._5_1_ = 0x33;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv
                                                         (emitter->buf,
                                                          (void *)((long)&capacity_20 + 4),2);
                                          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
                                          body_start_20 = 2;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv(emitter->buf,"",2);
                                          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
                                          sStack_a28 = emitter->buf->off;
                                          body_size_20._6_2_ = *(undefined2 *)&ppStack_a10->buf;
                                          body_size_20._4_1_ =
                                               (undefined1)((ushort)body_size_20._6_2_ >> 8);
                                          body_size_20._5_1_ = (undefined1)body_size_20._6_2_;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv
                                                         (emitter->buf,
                                                          (void *)((long)&body_size_20 + 4),2);
                                          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
                                          body_size_18 = emitter->buf->off - sStack_a28;
                                          for (; body_start_20 != 0;
                                              body_start_20 = body_start_20 - 1) {
                                            emitter->buf->base[sStack_a28 - body_start_20] =
                                                 (uint8_t)(body_size_18 >>
                                                          (((char)body_start_20 + -1) * '\b' & 0x3fU
                                                          ));
                                          }
                                        }
                                        server_name.len._4_4_ = 0;
                                        body_size_16 = emitter->buf->off - sStack_9e0;
                                        for (; body_start_18 != 0; body_start_18 = body_start_18 - 1
                                            ) {
                                          emitter->buf->base[sStack_9e0 - body_start_18] =
                                               (uint8_t)(body_size_16 >>
                                                        (((char)body_start_18 + -1) * '\b' & 0x3fU))
                                          ;
                                        }
                                        local_a48 = *(long *)_key_sched_2->secret - lStack_9a8;
                                        for (; body_start_16 != 0; body_start_16 = body_start_16 - 1
                                            ) {
                                          *(char *)(*(long *)_key_sched_2 +
                                                   (lStack_9a8 - body_start_16)) =
                                               (char)(local_a48 >>
                                                     (((char)body_start_16 + -1) * '\b' & 0x3fU));
                                        }
                                        if (mess_start_2 != 0) {
                                          ptls__key_schedule_update_hash
                                                    ((ptls_key_schedule_t *)mess_start_2,
                                                     (uint8_t *)(*(long *)_key_sched_2 + local_990),
                                                     *(long *)_key_sched_2->secret - local_990);
                                        }
                                        server_name.len._4_4_ = (*(code *)_buf_2[1].base)(_buf_2);
                                        if ((server_name.len._4_4_ == 0) &&
                                           (server_name.len._4_4_ =
                                                 push_change_cipher_spec(tls,emitter->buf),
                                           server_name.len._4_4_ == 0)) {
                                          tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                          if (ch.psk.identities.count._4_4_ != 0) {
                                            (tls->field_20).server.early_data_skipped_bytes = 0;
                                          }
                                          server_name.len._4_4_ = 0x202;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                _buf_1 = (ptls_buffer_t *)emitter;
                server_name.len._4_4_ = (*emitter->begin_message)(emitter);
                if (server_name.len._4_4_ == 0) {
                  _key_sched_1 = (ptls_key_schedule_t *)_buf_1->base;
                  mess_start_1 = 0;
                  local_7e8 = *(size_t *)_key_sched_1->secret;
                  capacity_6._7_1_ = 2;
                  server_name.len._4_4_ =
                       ptls_buffer__do_pushv
                                 ((ptls_buffer_t *)_key_sched_1,(void *)((long)&capacity_6 + 7),1);
                  if (server_name.len._4_4_ == 0) {
                    body_start_6 = 3;
                    server_name.len._4_4_ =
                         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_1,"",3);
                    if (server_name.len._4_4_ == 0) {
                      lStack_800 = *(long *)_key_sched_1->secret;
                      capacity_7._6_2_ = 0x303;
                      capacity_7._4_1_ = 3;
                      capacity_7._5_1_ = 3;
                      server_name.len._4_4_ =
                           ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_7 + 4),2);
                      if ((server_name.len._4_4_ == 0) &&
                         (server_name.len._4_4_ = ptls_buffer_reserve(emitter->buf,0x20),
                         server_name.len._4_4_ == 0)) {
                        puVar5 = emitter->buf->base;
                        sVar7 = emitter->buf->off;
                        puVar6 = puVar5 + sVar7;
                        puVar6[0] = 0xcf;
                        puVar6[1] = '!';
                        puVar6[2] = 0xad;
                        puVar6[3] = 't';
                        puVar6[4] = 0xe5;
                        puVar6[5] = 0x9a;
                        puVar6[6] = 'a';
                        puVar6[7] = '\x11';
                        puVar6 = puVar5 + sVar7 + 8;
                        puVar6[0] = 0xbe;
                        puVar6[1] = '\x1d';
                        puVar6[2] = 0x8c;
                        puVar6[3] = '\x02';
                        puVar6[4] = '\x1e';
                        puVar6[5] = 'e';
                        puVar6[6] = 0xb8;
                        puVar6[7] = 0x91;
                        puVar6 = puVar5 + sVar7 + 0x10;
                        puVar6[0] = 0xc2;
                        puVar6[1] = 0xa2;
                        puVar6[2] = '\x11';
                        puVar6[3] = '\x16';
                        puVar6[4] = 'z';
                        puVar6[5] = 0xbb;
                        puVar6[6] = 0x8c;
                        puVar6[7] = '^';
                        puVar5 = puVar5 + sVar7 + 0x18;
                        puVar5[0] = '\a';
                        puVar5[1] = 0x9e;
                        puVar5[2] = '\t';
                        puVar5[3] = 0xe2;
                        puVar5[4] = 200;
                        puVar5[5] = 0xa8;
                        puVar5[6] = '3';
                        puVar5[7] = 0x9c;
                        emitter->buf->off = emitter->buf->off + 0x20;
                        body_start_7 = 1;
                        server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",1);
                        if (server_name.len._4_4_ == 0) {
                          body_size_7 = emitter->buf->off;
                          server_name.len._4_4_ =
                               ptls_buffer__do_pushv
                                         (emitter->buf,ch.random_bytes,
                                          (size_t)ch.legacy_session_id.base);
                          if (server_name.len._4_4_ == 0) {
                            uStack_820 = emitter->buf->off - body_size_7;
                            for (; body_start_7 != 0; body_start_7 = body_start_7 - 1) {
                              emitter->buf->base[body_size_7 - body_start_7] =
                                   (uint8_t)(uStack_820 >>
                                            (((char)body_start_7 + -1) * '\b' & 0x3fU));
                            }
                            capacity_8._6_2_ = tls->cipher_suite->id;
                            capacity_8._4_1_ = (undefined1)(capacity_8._6_2_ >> 8);
                            capacity_8._5_1_ = (undefined1)capacity_8._6_2_;
                            server_name.len._4_4_ =
                                 ptls_buffer__do_pushv
                                           (emitter->buf,(void *)((long)&capacity_8 + 4),2);
                            if (server_name.len._4_4_ == 0) {
                              capacity_8._3_1_ = 0;
                              server_name.len._4_4_ =
                                   ptls_buffer__do_pushv
                                             (emitter->buf,(void *)((long)&capacity_8 + 3),1);
                              if (server_name.len._4_4_ == 0) {
                                body_start_8 = 2;
                                server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
                                if (server_name.len._4_4_ == 0) {
                                  sStack_838 = emitter->buf->off;
                                  capacity_9._6_2_ = 0x2b;
                                  capacity_9._4_1_ = 0;
                                  capacity_9._5_1_ = 0x2b;
                                  server_name.len._4_4_ =
                                       ptls_buffer__do_pushv
                                                 (emitter->buf,(void *)((long)&capacity_9 + 4),2);
                                  if (server_name.len._4_4_ == 0) {
                                    body_start_9 = 2;
                                    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2)
                                    ;
                                    if (server_name.len._4_4_ == 0) {
                                      sStack_850 = emitter->buf->off;
                                      body_size_9._6_2_ = (undefined2)ch.compression_methods.count;
                                      body_size_9._4_1_ =
                                           (undefined1)
                                           ((ushort)(undefined2)ch.compression_methods.count >> 8);
                                      body_size_9._5_1_ =
                                           (undefined1)(undefined2)ch.compression_methods.count;
                                      server_name.len._4_4_ =
                                           ptls_buffer__do_pushv
                                                     (emitter->buf,(void *)((long)&body_size_9 + 4),
                                                      2);
                                      if (server_name.len._4_4_ == 0) {
                                        _negotiated_group_1 =
                                             (ptls_key_exchange_algorithm_t *)
                                             (emitter->buf->off - sStack_850);
                                        for (; body_start_9 != 0; body_start_9 = body_start_9 - 1) {
                                          emitter->buf->base[sStack_850 - body_start_9] =
                                               (uint8_t)((ulong)_negotiated_group_1 >>
                                                        (((char)body_start_9 + -1) * '\b' & 0x3fU));
                                        }
                                        if (ppStack_538 == (ptls_key_exchange_algorithm_t *)0x0) {
                                          local_d58 = _emitter_1;
                                        }
                                        else {
                                          local_d58 = (ptls_message_emitter_t *)0x0;
                                        }
                                        ppStack_868 = local_d58;
                                        if (local_d58 != (ptls_message_emitter_t *)0x0) {
                                          capacity_10._6_2_ = 0x33;
                                          capacity_10._4_1_ = 0;
                                          capacity_10._5_1_ = 0x33;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv
                                                         (emitter->buf,
                                                          (void *)((long)&capacity_10 + 4),2);
                                          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
                                          body_start_10 = 2;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv(emitter->buf,"",2);
                                          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
                                          sStack_880 = emitter->buf->off;
                                          body_size_10._6_2_ = *(undefined2 *)&ppStack_868->buf;
                                          body_size_10._4_1_ =
                                               (undefined1)((ushort)body_size_10._6_2_ >> 8);
                                          body_size_10._5_1_ = (undefined1)body_size_10._6_2_;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv
                                                         (emitter->buf,
                                                          (void *)((long)&body_size_10 + 4),2);
                                          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
                                          sendbuf = (ptls_buffer_t *)
                                                    (emitter->buf->off - sStack_880);
                                          for (; body_start_10 != 0;
                                              body_start_10 = body_start_10 - 1) {
                                            emitter->buf->base[sStack_880 - body_start_10] =
                                                 (uint8_t)((ulong)sendbuf >>
                                                          (((char)body_start_10 + -1) * '\b' & 0x3fU
                                                          ));
                                          }
                                        }
                                        server_name.len._4_4_ = 0;
                                        ppStack_898 = emitter->buf;
                                        capacity_11._6_2_ = 0x2c;
                                        capacity_11._4_1_ = 0;
                                        capacity_11._5_1_ = 0x2c;
                                        server_name.len._4_4_ =
                                             ptls_buffer__do_pushv
                                                       (ppStack_898,(void *)((long)&capacity_11 + 4)
                                                        ,2);
                                        if (server_name.len._4_4_ == 0) {
                                          body_start_11 = 2;
                                          server_name.len._4_4_ =
                                               ptls_buffer__do_pushv(ppStack_898,"",2);
                                          if (server_name.len._4_4_ == 0) {
                                            capacity_12 = ppStack_898->off;
                                            body_start_12 = 2;
                                            server_name.len._4_4_ =
                                                 ptls_buffer__do_pushv(ppStack_898,"",2);
                                            if (server_name.len._4_4_ == 0) {
                                              tbs_start = ppStack_898->off;
                                              capacity_13 = ppStack_898->off;
                                              body_start_13 = 2;
                                              server_name.len._4_4_ =
                                                   ptls_buffer__do_pushv(ppStack_898,"",2);
                                              if (server_name.len._4_4_ == 0) {
                                                capacity_14 = ppStack_898->off;
                                                body_start_14 = 1;
                                                server_name.len._4_4_ =
                                                     ptls_buffer__do_pushv(ppStack_898,"",1);
                                                if (server_name.len._4_4_ == 0) {
                                                  sz = ppStack_898->off;
                                                  body_size_14 = tls->cipher_suite->hash->
                                                                 digest_size;
                                                  server_name.len._4_4_ =
                                                       ptls_buffer_reserve(ppStack_898,body_size_14)
                                                  ;
                                                  if (server_name.len._4_4_ == 0) {
                                                    key_schedule_extract_ch1hash
                                                              (tls->key_schedule,
                                                               ppStack_898->base + ppStack_898->off)
                                                    ;
                                                    ppStack_898->off =
                                                         body_size_14 + ppStack_898->off;
                                                    local_8f8 = ppStack_898->off - sz;
                                                    for (; body_start_14 != 0;
                                                        body_start_14 = body_start_14 - 1) {
                                                      ppStack_898->base[sz - body_start_14] =
                                                           (uint8_t)(local_8f8 >>
                                                                    (((char)body_start_14 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    body_size_13._7_1_ =
                                                         ppStack_538 ==
                                                         (ptls_key_exchange_algorithm_t *)0x0;
                                                    server_name.len._4_4_ =
                                                         ptls_buffer__do_pushv
                                                                   (ppStack_898,
                                                                    (void *)((long)&body_size_13 + 7
                                                                            ),1);
                                                    if (server_name.len._4_4_ == 0) {
                                                      tbs_len = ppStack_898->off - capacity_14;
                                                      for (; body_start_13 != 0;
                                                          body_start_13 = body_start_13 - 1) {
                                                        ppStack_898->base
                                                        [capacity_14 - body_start_13] =
                                                             (uint8_t)(tbs_len >>
                                                                      (((char)body_start_13 + -1) *
                                                                       '\b' & 0x3fU));
                                                      }
                                                      capacity_15 = ppStack_898->off - capacity_13;
                                                      body_start_15 = 1;
                                                      server_name.len._4_4_ =
                                                           ptls_buffer__do_pushv(ppStack_898,"",1);
                                                      if (server_name.len._4_4_ == 0) {
                                                        sz_1 = ppStack_898->off;
                                                        local_928 = (*tls->ctx->cipher_suites)->hash
                                                                    ->digest_size;
                                                        server_name.len._4_4_ =
                                                             ptls_buffer_reserve(ppStack_898,
                                                                                 local_928);
                                                        properties_00 = ch._1248_8_;
                                                        if (server_name.len._4_4_ == 0) {
                                                          _body_size_15 =
                                                               ptls_iovec_init(ppStack_898->base +
                                                                               capacity_13,
                                                                               capacity_15);
                                                          server_name.len._4_4_ =
                                                               calc_cookie_signature
                                                                         (tls,(
                                                  ptls_handshake_properties_t *)properties_00,
                                                  (ptls_key_exchange_algorithm_t *)_emitter_1,
                                                  _body_size_15,ppStack_898->base + ppStack_898->off
                                                  );
                                                  if (server_name.len._4_4_ == 0) {
                                                    ppStack_898->off = local_928 + ppStack_898->off;
                                                    body_size_12 = ppStack_898->off - sz_1;
                                                    for (; body_start_15 != 0;
                                                        body_start_15 = body_start_15 - 1) {
                                                      ppStack_898->base[sz_1 - body_start_15] =
                                                           (uint8_t)(body_size_12 >>
                                                                    (((char)body_start_15 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    body_size_11 = ppStack_898->off - tbs_start;
                                                    for (; body_start_12 != 0;
                                                        body_start_12 = body_start_12 - 1) {
                                                      ppStack_898->base[tbs_start - body_start_12] =
                                                           (uint8_t)(body_size_11 >>
                                                                    (((char)body_start_12 + -1) *
                                                                     '\b' & 0x3fU));
                                                    }
                                                    body_size_8 = ppStack_898->off - capacity_12;
                                                    for (; body_start_11 != 0;
                                                        body_start_11 = body_start_11 - 1) {
                                                      ppStack_898->base[capacity_12 - body_start_11]
                                                           = (uint8_t)(body_size_8 >>
                                                                      (((char)body_start_11 + -1) *
                                                                       '\b' & 0x3fU));
                                                    }
                                                    body_size_6 = emitter->buf->off - sStack_838;
                                                    for (; body_start_8 != 0;
                                                        body_start_8 = body_start_8 - 1) {
                                                      emitter->buf->base[sStack_838 - body_start_8]
                                                           = (uint8_t)(body_size_6 >>
                                                                      (((char)body_start_8 + -1) *
                                                                       '\b' & 0x3fU));
                                                    }
                                                    local_960 = *(long *)_key_sched_1->secret -
                                                                lStack_800;
                                                    for (; body_start_6 != 0;
                                                        body_start_6 = body_start_6 - 1) {
                                                      *(char *)(*(long *)_key_sched_1 +
                                                               (lStack_800 - body_start_6)) =
                                                           (char)(local_960 >>
                                                                 (((char)body_start_6 + -1) * '\b' &
                                                                 0x3fU));
                                                    }
                                                    if (mess_start_1 != 0) {
                                                      ptls__key_schedule_update_hash
                                                                ((ptls_key_schedule_t *)mess_start_1
                                                                 ,(uint8_t *)
                                                                  (*(long *)_key_sched_1 + local_7e8
                                                                  ),*(long *)_key_sched_1->secret -
                                                                    local_7e8);
                                                    }
                                                    server_name.len._4_4_ =
                                                         (*(code *)_buf_1[1].base)(_buf_1);
                                                    if ((server_name.len._4_4_ == 0) &&
                                                       (server_name.len._4_4_ =
                                                             push_change_cipher_spec
                                                                       (tls,emitter->buf),
                                                       server_name.len._4_4_ == 0)) {
                                                      server_name.len._4_4_ = 0x206;
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0012ad51;
        }
      }
      else {
        local_6b0 = (uint8_t *)(*tls->ctx->cipher_suites)->hash->digest_size;
        server_name.len._4_4_ =
             calc_cookie_signature
                       (tls,(ptls_handshake_properties_t *)ch._1248_8_,ppStack_538,
                        (ptls_iovec_t)ch.cookie._8_16_,(uint8_t *)&sigsize);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        if ((ch.cookie.signature.base != local_6b0) ||
           (iVar3 = (*ptls_mem_equal)((void *)ch.cookie.ch1_hash.len,&sigsize,(size_t)local_6b0),
           iVar3 == 0)) {
          server_name.len._4_4_ = 0x28;
          goto LAB_0012ad51;
        }
        key_schedule_update_ch1hash_prefix(tls->key_schedule);
        ptls__key_schedule_update_hash
                  (tls->key_schedule,(uint8_t *)ch.cookie.tbs.len,(size_t)ch.cookie.ch1_hash.base);
        ppVar4 = tls->key_schedule;
        _hrr_start = ptls_iovec_init((void *)0x0,0);
        key_schedule_extract(ppVar4,_hrr_start);
        _emitter = (ptls_message_emitter_t *)emitter->buf->off;
        _buf = (ptls_buffer_t *)emitter;
        server_name.len._4_4_ = (*emitter->begin_message)(emitter);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        _key_sched = (ptls_key_schedule_t *)_buf->base;
        mess_start = (size_t)tls->key_schedule;
        local_6e8 = *(size_t *)_key_sched->secret;
        capacity._7_1_ = 2;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start = 3;
        server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        lStack_700 = *(long *)_key_sched->secret;
        capacity_1._6_2_ = 0x303;
        capacity_1._4_1_ = 3;
        capacity_1._5_1_ = 3;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_1 + 4),2);
        if ((server_name.len._4_4_ != 0) ||
           (server_name.len._4_4_ = ptls_buffer_reserve(emitter->buf,0x20),
           server_name.len._4_4_ != 0)) goto LAB_0012ad51;
        puVar8 = emitter->buf->base;
        sVar1 = emitter->buf->off;
        puVar5 = puVar8 + sVar1;
        puVar5[0] = 0xcf;
        puVar5[1] = '!';
        puVar5[2] = 0xad;
        puVar5[3] = 't';
        puVar5[4] = 0xe5;
        puVar5[5] = 0x9a;
        puVar5[6] = 'a';
        puVar5[7] = '\x11';
        puVar5 = puVar8 + sVar1 + 8;
        puVar5[0] = 0xbe;
        puVar5[1] = '\x1d';
        puVar5[2] = 0x8c;
        puVar5[3] = '\x02';
        puVar5[4] = '\x1e';
        puVar5[5] = 'e';
        puVar5[6] = 0xb8;
        puVar5[7] = 0x91;
        puVar5 = puVar8 + sVar1 + 0x10;
        puVar5[0] = 0xc2;
        puVar5[1] = 0xa2;
        puVar5[2] = '\x11';
        puVar5[3] = '\x16';
        puVar5[4] = 'z';
        puVar5[5] = 0xbb;
        puVar5[6] = 0x8c;
        puVar5[7] = '^';
        puVar8 = puVar8 + sVar1 + 0x18;
        puVar8[0] = '\a';
        puVar8[1] = 0x9e;
        puVar8[2] = '\t';
        puVar8[3] = 0xe2;
        puVar8[4] = 200;
        puVar8[5] = 0xa8;
        puVar8[6] = '3';
        puVar8[7] = 0x9c;
        emitter->buf->off = emitter->buf->off + 0x20;
        body_start_1 = 1;
        server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",1);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_size_1 = emitter->buf->off;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,ch.random_bytes,(size_t)ch.legacy_session_id.base);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        uStack_720 = emitter->buf->off - body_size_1;
        for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
          emitter->buf->base[body_size_1 - body_start_1] =
               (uint8_t)(uStack_720 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
        }
        capacity_2._6_2_ = tls->cipher_suite->id;
        capacity_2._4_1_ = (undefined1)(capacity_2._6_2_ >> 8);
        capacity_2._5_1_ = (undefined1)capacity_2._6_2_;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_2 + 4),2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        capacity_2._3_1_ = 0;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_2 + 3),1);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_2 = 2;
        server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        sStack_738 = emitter->buf->off;
        capacity_3._6_2_ = 0x2b;
        capacity_3._4_1_ = 0;
        capacity_3._5_1_ = 0x2b;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_3 + 4),2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_3 = 2;
        server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        sStack_750 = emitter->buf->off;
        body_size_3._6_2_ = (undefined2)ch.compression_methods.count;
        body_size_3._4_1_ = (undefined1)((ushort)(undefined2)ch.compression_methods.count >> 8);
        body_size_3._5_1_ = (undefined1)(undefined2)ch.compression_methods.count;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,(void *)((long)&body_size_3 + 4),2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        _negotiated_group = (ptls_key_exchange_algorithm_t *)(emitter->buf->off - sStack_750);
        for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
          emitter->buf->base[sStack_750 - body_start_3] =
               (uint8_t)((ulong)_negotiated_group >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
        }
        if (((byte)ch.cookie.signature.len & 1) == 0) {
          local_d50 = (ptls_key_exchange_algorithm_t *)0x0;
        }
        else {
          local_d50 = ppStack_538;
        }
        ppStack_768 = local_d50;
        if (local_d50 != (ptls_key_exchange_algorithm_t *)0x0) {
          capacity_4._6_2_ = 0x33;
          capacity_4._4_1_ = 0;
          capacity_4._5_1_ = 0x33;
          server_name.len._4_4_ =
               ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_4 + 4),2);
          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
          body_start_4 = 2;
          server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
          sStack_780 = emitter->buf->off;
          body_size_4._6_2_ = ppStack_768->id;
          body_size_4._4_1_ = (undefined1)(body_size_4._6_2_ >> 8);
          body_size_4._5_1_ = (undefined1)body_size_4._6_2_;
          server_name.len._4_4_ =
               ptls_buffer__do_pushv(emitter->buf,(void *)((long)&body_size_4 + 4),2);
          if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
          uStack_790 = emitter->buf->off - sStack_780;
          for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
            emitter->buf->base[sStack_780 - body_start_4] =
                 (uint8_t)(uStack_790 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
          }
        }
        server_name.len._4_4_ = 0;
        capacity_5._6_2_ = 0x2c;
        capacity_5._4_1_ = 0;
        capacity_5._5_1_ = 0x2c;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_5 + 4),2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_5 = 2;
        server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_size_5 = emitter->buf->off;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv
                       (emitter->buf,(void *)ch.client_ciphers.count,(size_t)ch.cookie.all.base);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_size_2 = emitter->buf->off - body_size_5;
        for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
          emitter->buf->base[body_size_5 - body_start_5] =
               (uint8_t)(body_size_2 >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
        }
        body_size = emitter->buf->off - sStack_738;
        for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
          emitter->buf->base[sStack_738 - body_start_2] =
               (uint8_t)(body_size >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
        }
        negotiated_group =
             (ptls_key_exchange_algorithm_t *)(*(long *)_key_sched->secret - lStack_700);
        for (; body_start != 0; body_start = body_start - 1) {
          *(char *)(*(long *)_key_sched + (lStack_700 - body_start)) =
               (char)((ulong)negotiated_group >> (((char)body_start + -1) * '\b' & 0x3fU));
        }
        if (mess_start != 0) {
          ptls__key_schedule_update_hash
                    ((ptls_key_schedule_t *)mess_start,(uint8_t *)(*(long *)_key_sched + local_6e8),
                     *(long *)_key_sched->secret - local_6e8);
        }
        server_name.len._4_4_ = (*(code *)_buf[1].base)(_buf);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        emitter->buf->off = (size_t)_emitter;
        bVar9 = true;
        server_name.len._4_4_ = 0;
      }
    }
    server_name.len._4_4_ =
         report_unknown_extensions
                   (tls,(ptls_handshake_properties_t *)ch._1248_8_,
                    (ptls_raw_extension_t *)&ch.psk.ke_modes);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    if ((((!bVar9) && (ch.cookie._64_8_ != 0)) && (((uint)ch.psk.identities.count & 3) != 0)) &&
       ((tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0 &&
        (((byte)tls->ctx->field_0x68 >> 3 & 1) == 0)))) {
      local_a58 = ptls_iovec_init(puVar6,ch.cookie._64_8_ - (long)puVar6);
      server_name.len._4_4_ =
           try_psk_handshake(tls,&pubkey.len,&ret,(st_ptls_client_hello_t *)&key_share.peer_key.len,
                             local_a58);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    }
    server_name.len._4_4_ = 0;
    if ((pubkey.len == 0xffffffffffffffff) || (((byte)tls->ctx->field_0x68 >> 3 & 1) != 0)) {
      ptls__key_schedule_update_hash(tls->key_schedule,puVar6,sVar7);
      if (!bVar9) {
        if (tls->key_schedule->generation != 0) {
          __assert_fail("tls->key_schedule->generation == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                        ,0xed9,
                        "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                       );
        }
        ppVar4 = tls->key_schedule;
        _selected = ptls_iovec_init((void *)0x0,0);
        key_schedule_extract(ppVar4,_selected);
      }
      psk_index._4_4_ = 0;
      if (ch._1248_8_ != 0) {
        *(undefined8 *)(ch._1248_8_ + 0x40) = 0;
      }
    }
    else {
      ptls__key_schedule_update_hash
                (tls->key_schedule,(uint8_t *)ch.cookie._64_8_,
                 (size_t)(puVar6 + (sVar7 - ch.cookie._64_8_)));
      if (((uint)ch.psk.identities.count & 1) == 0) {
        if (((uint)ch.psk.identities.count & 2) == 0) {
          __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                        ,0xee4,
                        "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                       );
        }
        psk_index._4_4_ = 2;
      }
      else {
        psk_index._4_4_ = 1;
      }
      tls->field_0x160 = tls->field_0x160 & 0xfd | 2;
      if (ch._1248_8_ != 0) {
        _emitter_3 = (ptls_message_emitter_t *)
                     &ch.psk.identities.list[pubkey.len].obfuscated_ticket_age;
        memcpy((void *)ch._1248_8_,*(void **)_emitter_3,
               (size_t)ch.psk.identities.list[pubkey.len].binder.base);
        *(st_ptls_traffic_protection_t **)(ch._1248_8_ + 0x40) = _emitter_3->enc;
      }
    }
    if (((ret != 0) && (tls->ctx->max_early_data_size != 0)) && (pubkey.len == 0)) {
      puVar6 = (uint8_t *)malloc(0x40);
      tls->pending_handshake_secret = puVar6;
      if (puVar6 == (uint8_t *)0x0) {
        server_name.len._4_4_ = 0x201;
        goto LAB_0012ad51;
      }
      server_name.len._4_4_ = derive_exporter_secret(tls,1);
      if ((server_name.len._4_4_ != 0) ||
         (server_name.len._4_4_ = setup_traffic_protection(tls,0,"c e traffic",1,0),
         server_name.len._4_4_ != 0)) goto LAB_0012ad51;
      server_name.len._4_4_ = 0;
    }
    if (psk_index._4_4_ != 1) {
      if (ppStack_538 == (st_ptls_key_exchange_algorithm_t *)0x0) {
        server_name.len._4_4_ = 0x6d;
        if (ch.negotiated_groups.len != 0) {
          server_name.len._4_4_ = 0x28;
        }
        goto LAB_0012ad51;
      }
      server_name.len._4_4_ =
           (*ppStack_538->exchange)
                     (ppStack_538,(ptls_iovec_t *)&ecdh_secret.len,
                      (ptls_iovec_t *)(finished_key + 0x38),(ptls_iovec_t)key_share._0_16_);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      tls->key_share = ppStack_538;
      server_name.len._4_4_ = 0;
    }
    _buf_3 = (ptls_buffer_t *)emitter;
    server_name.len._4_4_ = (*emitter->begin_message)(emitter);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    _key_sched_3 = (ptls_key_schedule_t *)_buf_3->base;
    mess_start_3 = (size_t)tls->key_schedule;
    local_a90 = *(size_t *)_key_sched_3->secret;
    capacity_21._7_1_ = 2;
    server_name.len._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_3,(void *)((long)&capacity_21 + 7),1);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    body_start_21 = 3;
    server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_3,"",3);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    lStack_aa8 = *(long *)_key_sched_3->secret;
    capacity_22._6_2_ = 0x303;
    capacity_22._4_1_ = 3;
    capacity_22._5_1_ = 3;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_22 + 4),2);
    if ((server_name.len._4_4_ != 0) ||
       (server_name.len._4_4_ = ptls_buffer_reserve(emitter->buf,0x20), server_name.len._4_4_ != 0))
    goto LAB_0012ad51;
    (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
    emitter->buf->off = emitter->buf->off + 0x20;
    body_start_22 = 1;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",1);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    body_size_22 = emitter->buf->off;
    server_name.len._4_4_ =
         ptls_buffer__do_pushv(emitter->buf,ch.random_bytes,(size_t)ch.legacy_session_id.base);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    uStack_ac8 = emitter->buf->off - body_size_22;
    for (; body_start_22 != 0; body_start_22 = body_start_22 - 1) {
      emitter->buf->base[body_size_22 - body_start_22] =
           (uint8_t)(uStack_ac8 >> (((char)body_start_22 + -1) * '\b' & 0x3fU));
    }
    capacity_23._6_2_ = tls->cipher_suite->id;
    capacity_23._4_1_ = (undefined1)(capacity_23._6_2_ >> 8);
    capacity_23._5_1_ = (undefined1)capacity_23._6_2_;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_23 + 4),2);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    capacity_23._3_1_ = 0;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_23 + 3),1);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    body_start_23 = 2;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    sStack_ae0 = emitter->buf->off;
    capacity_24._6_2_ = 0x2b;
    capacity_24._4_1_ = 0;
    capacity_24._5_1_ = 0x2b;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&capacity_24 + 4),2);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    body_start_24 = 2;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,"",2);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    sStack_af8 = emitter->buf->off;
    body_size_24._6_2_ = (undefined2)ch.compression_methods.count;
    body_size_24._4_1_ = (undefined1)((ushort)(undefined2)ch.compression_methods.count >> 8);
    body_size_24._5_1_ = (undefined1)(undefined2)ch.compression_methods.count;
    server_name.len._4_4_ = ptls_buffer__do_pushv(emitter->buf,(void *)((long)&body_size_24 + 4),2);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    sendbuf_1 = (ptls_buffer_t *)(emitter->buf->off - sStack_af8);
    for (; body_start_24 != 0; body_start_24 = body_start_24 - 1) {
      emitter->buf->base[sStack_af8 - body_start_24] =
           (uint8_t)((ulong)sendbuf_1 >> (((char)body_start_24 + -1) * '\b' & 0x3fU));
    }
    ppStack_b10 = emitter->buf;
    if (psk_index._4_4_ != 1) {
      capacity_25._6_2_ = 0x33;
      capacity_25._4_1_ = 0;
      capacity_25._5_1_ = 0x33;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,(void *)((long)&capacity_25 + 4),2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_start_25 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      sStack_b28 = ppStack_b10->off;
      capacity_26._6_2_ = ppStack_538->id;
      capacity_26._4_1_ = (undefined1)(capacity_26._6_2_ >> 8);
      capacity_26._5_1_ = (undefined1)capacity_26._6_2_;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,(void *)((long)&capacity_26 + 4),2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_start_26 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_26 = ppStack_b10->off;
      server_name.len._4_4_ =
           ptls_buffer__do_pushv(ppStack_b10,(void *)ecdh_secret.len,(size_t)pubkey.base);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_25 = ppStack_b10->off - body_size_26;
      for (; body_start_26 != 0; body_start_26 = body_start_26 - 1) {
        ppStack_b10->base[body_size_26 - body_start_26] =
             (uint8_t)(body_size_25 >> (((char)body_start_26 + -1) * '\b' & 0x3fU));
      }
      uStack_b50 = ppStack_b10->off - sStack_b28;
      for (; body_start_25 != 0; body_start_25 = body_start_25 - 1) {
        ppStack_b10->base[sStack_b28 - body_start_25] =
             (uint8_t)(uStack_b50 >> (((char)body_start_25 + -1) * '\b' & 0x3fU));
      }
    }
    server_name.len._4_4_ = 0;
    if (psk_index._4_4_ != 0) {
      capacity_27._6_2_ = 0x29;
      capacity_27._4_1_ = 0;
      capacity_27._5_1_ = 0x29;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,(void *)((long)&capacity_27 + 4),2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_start_27 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      sStack_b68 = ppStack_b10->off;
      body_size_27._6_2_ = (undefined2)pubkey.len;
      body_size_27._4_1_ = (undefined1)(pubkey.len >> 8);
      body_size_27._5_1_ = (undefined1)pubkey.len;
      server_name.len._4_4_ = ptls_buffer__do_pushv(ppStack_b10,(void *)((long)&body_size_27 + 4),2)
      ;
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_23 = ppStack_b10->off - sStack_b68;
      for (; body_start_27 != 0; body_start_27 = body_start_27 - 1) {
        ppStack_b10->base[sStack_b68 - body_start_27] =
             (uint8_t)(body_size_23 >> (((char)body_start_27 + -1) * '\b' & 0x3fU));
      }
    }
    server_name.len._4_4_ = 0;
    body_size_21 = emitter->buf->off - sStack_ae0;
    for (; body_start_23 != 0; body_start_23 = body_start_23 - 1) {
      emitter->buf->base[sStack_ae0 - body_start_23] =
           (uint8_t)(body_size_21 >> (((char)body_start_23 + -1) * '\b' & 0x3fU));
    }
    _emitter_4 = (ptls_message_emitter_t *)(*(long *)_key_sched_3->secret - lStack_aa8);
    for (; body_start_21 != 0; body_start_21 = body_start_21 - 1) {
      *(char *)(*(long *)_key_sched_3 + (lStack_aa8 - body_start_21)) =
           (char)((ulong)_emitter_4 >> (((char)body_start_21 + -1) * '\b' & 0x3fU));
    }
    if (mess_start_3 != 0) {
      ptls__key_schedule_update_hash
                ((ptls_key_schedule_t *)mess_start_3,(uint8_t *)(*(long *)_key_sched_3 + local_a90),
                 *(long *)_key_sched_3->secret - local_a90);
    }
    server_name.len._4_4_ = (*(code *)_buf_3[1].base)(_buf_3);
    if ((server_name.len._4_4_ != 0) ||
       (server_name.len._4_4_ = push_change_cipher_spec(tls,emitter->buf),
       server_name.len._4_4_ != 0)) goto LAB_0012ad51;
    if (tls->key_schedule->generation != 1) {
      __assert_fail("tls->key_schedule->generation == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0xf19,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    pVar10.len = (size_t)ecdh_secret.base;
    pVar10.base = (uint8_t *)finished_key._56_8_;
    key_schedule_extract(tls->key_schedule,pVar10);
    server_name.len._4_4_ = setup_traffic_protection(tls,1,"s hs traffic",2,0);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    if (tls->pending_handshake_secret == (uint8_t *)0x0) {
      server_name.len._4_4_ = setup_traffic_protection(tls,0,"c hs traffic",2,0);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      if (ch.psk.identities.count._4_4_ != 0) {
        (tls->field_20).server.early_data_skipped_bytes = 0;
      }
      iVar3 = 0;
    }
    else {
      server_name.len._4_4_ =
           derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
      if ((server_name.len._4_4_ != 0) ||
         ((iVar3 = 0, tls->ctx->update_traffic_key != (ptls_update_traffic_key_t *)0x0 &&
          (server_name.len._4_4_ =
                (*tls->ctx->update_traffic_key->cb)
                          (tls->ctx->update_traffic_key,tls,0,2,tls->pending_handshake_secret),
          iVar3 = server_name.len._4_4_, server_name.len._4_4_ != 0)))) goto LAB_0012ad51;
    }
    server_name.len._4_4_ = iVar3;
    _buf_4 = (ptls_buffer_t *)emitter;
    server_name.len._4_4_ = (*emitter->begin_message)(emitter);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    _key_sched_4 = (ptls_key_schedule_t *)_buf_4->base;
    mess_start_4 = (size_t)tls->key_schedule;
    local_ba8 = *(size_t *)_key_sched_4->secret;
    capacity_28._7_1_ = 8;
    server_name.len._4_4_ =
         ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_4,(void *)((long)&capacity_28 + 7),1);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    body_start_28 = 3;
    server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_4,"",3);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    sendbuf_2 = *(ptls_buffer_t **)_key_sched_4->secret;
    capacity_29 = (size_t)emitter->buf;
    body_start_29 = 2;
    server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",2);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    lStack_bd8 = *(long *)(capacity_29 + 0x10);
    if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
      if (tls->server_name != (char *)0x0) {
        capacity_31._6_2_ = 0;
        capacity_31._4_1_ = 0;
        capacity_31._5_1_ = 0;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,(void *)((long)&capacity_31 + 4),2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_31 = 2;
        server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_size_31 = *(size_t *)(capacity_29 + 0x10);
        uStack_c18 = *(long *)(capacity_29 + 0x10) - body_size_31;
        for (; body_start_31 != 0; body_start_31 = body_start_31 - 1) {
          *(char *)(*(long *)capacity_29 + (body_size_31 - body_start_31)) =
               (char)(uStack_c18 >> (((char)body_start_31 + -1) * '\b' & 0x3fU));
        }
      }
      server_name.len._4_4_ = 0;
    }
    else {
      capacity_30._6_2_ = 0xffce;
      capacity_30._4_1_ = 0xff;
      capacity_30._5_1_ = 0xce;
      server_name.len._4_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,(void *)((long)&capacity_30 + 4),2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_start_30 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_30 = *(size_t *)(capacity_29 + 0x10);
      server_name.len._4_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,tls->esni->nonce,0x10);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      uStack_bf8 = *(long *)(capacity_29 + 0x10) - body_size_30;
      for (; body_start_30 != 0; body_start_30 = body_start_30 - 1) {
        *(char *)(*(long *)capacity_29 + (body_size_30 - body_start_30)) =
             (char)(uStack_bf8 >> (((char)body_start_30 + -1) * '\b' & 0x3fU));
      }
      free_esni_secret(&tls->esni,1);
    }
    if (tls->negotiated_protocol != (char *)0x0) {
      capacity_32._6_2_ = 0x10;
      capacity_32._4_1_ = 0;
      capacity_32._5_1_ = 0x10;
      server_name.len._4_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,(void *)((long)&capacity_32 + 4),2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_start_32 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      capacity_33 = *(size_t *)(capacity_29 + 0x10);
      body_start_33 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      capacity_34 = *(size_t *)(capacity_29 + 0x10);
      body_start_34 = 1;
      server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",1);
      sVar7 = capacity_29;
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_34 = *(size_t *)(capacity_29 + 0x10);
      src_00 = tls->negotiated_protocol;
      len = strlen(tls->negotiated_protocol);
      server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)sVar7,src_00,len);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_33 = *(long *)(capacity_29 + 0x10) - body_size_34;
      for (; body_start_34 != 0; body_start_34 = body_start_34 - 1) {
        *(char *)(*(long *)capacity_29 + (body_size_34 - body_start_34)) =
             (char)(body_size_33 >> (((char)body_start_34 + -1) * '\b' & 0x3fU));
      }
      body_size_32 = *(long *)(capacity_29 + 0x10) - capacity_34;
      for (; body_start_33 != 0; body_start_33 = body_start_33 - 1) {
        *(char *)(*(long *)capacity_29 + (capacity_34 - body_start_33)) =
             (char)(body_size_32 >> (((char)body_start_33 + -1) * '\b' & 0x3fU));
      }
      uStack_c68 = *(long *)(capacity_29 + 0x10) - capacity_33;
      for (; body_start_32 != 0; body_start_32 = body_start_32 - 1) {
        *(char *)(*(long *)capacity_29 + (capacity_33 - body_start_32)) =
             (char)(uStack_c68 >> (((char)body_start_32 + -1) * '\b' & 0x3fU));
      }
      server_name.len._4_4_ = 0;
    }
    if (tls->pending_handshake_secret != (uint8_t *)0x0) {
      capacity_35._6_2_ = 0x2a;
      capacity_35._4_1_ = 0;
      capacity_35._5_1_ = 0x2a;
      server_name.len._4_4_ =
           ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,(void *)((long)&capacity_35 + 4),2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_start_35 = 2;
      server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)capacity_29,"",2);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      body_size_35 = *(size_t *)(capacity_29 + 0x10);
      body_size_29 = *(long *)(capacity_29 + 0x10) - body_size_35;
      for (; body_start_35 != 0; body_start_35 = body_start_35 - 1) {
        *(char *)(*(long *)capacity_29 + (body_size_35 - body_start_35)) =
             (char)(body_size_29 >> (((char)body_start_35 + -1) * '\b' & 0x3fU));
      }
      server_name.len._4_4_ = 0;
    }
    server_name.len._4_4_ =
         push_additional_extensions
                   ((ptls_handshake_properties_t *)ch._1248_8_,(ptls_buffer_t *)capacity_29);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    body_size_28 = *(long *)(capacity_29 + 0x10) - lStack_bd8;
    for (; body_start_29 != 0; body_start_29 = body_start_29 - 1) {
      *(char *)(*(long *)capacity_29 + (lStack_bd8 - body_start_29)) =
           (char)(body_size_28 >> (((char)body_start_29 + -1) * '\b' & 0x3fU));
    }
    _emitter_5 = (ptls_message_emitter_t *)(*(long *)_key_sched_4->secret - (long)sendbuf_2);
    for (; body_start_28 != 0; body_start_28 = body_start_28 - 1) {
      *(char *)((long)sendbuf_2 + (*(long *)_key_sched_4 - body_start_28)) =
           (char)((ulong)_emitter_5 >> (((char)body_start_28 + -1) * '\b' & 0x3fU));
    }
    if (mess_start_4 != 0) {
      ptls__key_schedule_update_hash
                ((ptls_key_schedule_t *)mess_start_4,(uint8_t *)(*(long *)_key_sched_4 + local_ba8),
                 *(long *)_key_sched_4->secret - local_ba8);
    }
    server_name.len._4_4_ = (*(code *)_buf_4[1].base)(_buf_4);
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
    if (psk_index._4_4_ == 0) {
      if (((byte)tls->ctx->field_0x68 >> 3 & 1) != 0) {
        _buf_5 = (ptls_buffer_t *)emitter;
        server_name.len._4_4_ = (*emitter->begin_message)(emitter);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        _key_sched_5 = (ptls_key_schedule_t *)_buf_5->base;
        mess_start_5 = (size_t)tls->key_schedule;
        local_cb8 = *(size_t *)_key_sched_5->secret;
        capacity_36._7_1_ = 0xd;
        server_name.len._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_5,(void *)((long)&capacity_36 + 7),1)
        ;
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_36 = 3;
        server_name.len._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched_5,"",3);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        sendbuf_3 = *(ptls_buffer_t **)_key_sched_5->secret;
        local_cd8 = emitter->buf;
        capacity_37._7_1_ = 0;
        server_name.len._4_4_ = ptls_buffer__do_pushv(local_cd8,(void *)((long)&capacity_37 + 7),1);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_37 = 2;
        server_name.len._4_4_ = ptls_buffer__do_pushv(local_cd8,"",2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        sStack_cf0 = local_cd8->off;
        capacity_38._6_2_ = 0xd;
        capacity_38._4_1_ = 0;
        capacity_38._5_1_ = 0xd;
        server_name.len._4_4_ = ptls_buffer__do_pushv(local_cd8,(void *)((long)&capacity_38 + 4),2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        body_start_38 = 2;
        server_name.len._4_4_ = ptls_buffer__do_pushv(local_cd8,"",2);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        sVar7 = local_cd8->off;
        server_name.len._4_4_ = push_signature_algorithms(local_cd8);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
        sVar1 = local_cd8->off;
        for (; body_start_38 != 0; body_start_38 = body_start_38 - 1) {
          local_cd8->base[sVar7 - body_start_38] =
               (uint8_t)(sVar1 - sVar7 >> (((char)body_start_38 + -1) * '\b' & 0x3fU));
        }
        sVar7 = local_cd8->off;
        for (; body_start_37 != 0; body_start_37 = body_start_37 - 1) {
          local_cd8->base[sStack_cf0 - body_start_37] =
               (uint8_t)(sVar7 - sStack_cf0 >> (((char)body_start_37 + -1) * '\b' & 0x3fU));
        }
        lVar2 = *(long *)_key_sched_5->secret;
        for (; body_start_36 != 0; body_start_36 = body_start_36 - 1) {
          *(char *)((long)sendbuf_3 + (*(long *)_key_sched_5 - body_start_36)) =
               (char)((ulong)(lVar2 - (long)sendbuf_3) >>
                     (((char)body_start_36 + -1) * '\b' & 0x3fU));
        }
        if (mess_start_5 != 0) {
          ptls__key_schedule_update_hash
                    ((ptls_key_schedule_t *)mess_start_5,
                     (uint8_t *)(*(long *)_key_sched_5 + local_cb8),
                     *(long *)_key_sched_5->secret - local_cb8);
        }
        server_name.len._4_4_ = (*(code *)_buf_5[1].base)(_buf_5);
        if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      }
      server_name.len._4_4_ = 0;
      goto LAB_0012aa97;
    }
  }
  else {
    ch.psk.identities.count._0_4_ = tls->handshake_ke_modes;
LAB_0012aa97:
    pVar10 = ptls_iovec_init((void *)0x0,0);
    server_name.len._4_4_ =
         send_certificate_and_certificate_verify
                   (tls,emitter,(st_ptls_signature_algorithms_t *)&ch.key_shares.len,pVar10,
                    "TLS 1.3, server CertificateVerify",
                    (uint)((byte)ch.unknown_extensions[0x10].data.len & 1));
    if (((byte)tls->field_0x160 >> 5 & 1) != 0) {
      tls->handshake_ke_modes = (uint)ch.psk.identities.count;
      return 0x202;
    }
    if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
  }
  server_name.len._4_4_ = 0;
  send_finished(tls,emitter);
  if (tls->key_schedule->generation != 2) {
    __assert_fail("tls->key_schedule->generation == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0xf6f,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ppVar4 = tls->key_schedule;
  pVar10 = ptls_iovec_init((void *)0x0,0);
  server_name.len._4_4_ = key_schedule_extract(ppVar4,pVar10);
  if ((((server_name.len._4_4_ == 0) &&
       (server_name.len._4_4_ = setup_traffic_protection(tls,1,"s ap traffic",3,0),
       server_name.len._4_4_ == 0)) &&
      (server_name.len._4_4_ = derive_secret(tls->key_schedule,&tls->field_20,"c ap traffic"),
      server_name.len._4_4_ == 0)) &&
     (server_name.len._4_4_ = derive_exporter_secret(tls,0), server_name.len._4_4_ == 0)) {
    if (tls->pending_handshake_secret == (uint8_t *)0x0) {
      if (((byte)tls->ctx->field_0x68 >> 3 & 1) == 0) {
        tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
      }
      else {
        tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
      }
    }
    else if (((byte)tls->ctx->field_0x68 >> 4 & 1) == 0) {
      tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
    }
    else {
      server_name.len._4_4_ = commission_handshake_secret(tls);
      if (server_name.len._4_4_ != 0) goto LAB_0012ad51;
      tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }
    server_name.len._4_4_ = 0;
    if ((((uint)ch.psk.identities.count == 0) || (tls->ctx->ticket_lifetime == 0)) ||
       (server_name.len._4_4_ = send_session_ticket(tls,emitter), server_name.len._4_4_ == 0)) {
      if (((byte)tls->ctx->field_0x68 >> 3 & 1) == 0) {
        server_name.len._4_4_ = 0;
      }
      else {
        server_name.len._4_4_ = 0x202;
      }
    }
  }
LAB_0012ad51:
  free((void *)ecdh_secret.len);
  free((void *)finished_key._56_8_);
  (*ptls_clear_memory)(&is_second_flight,0x40);
  return server_name.len._4_4_;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }